

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O2

void TestModelCreation(Arguments *args)

{
  ostream *poVar1;
  PlanningUnitMADPDiscreteParameters params;
  ProblemDecTiger pdt;
  JESPExhaustivePlanner JESPe;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-       TestModelCreation()      -");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProblemDecTiger::ProblemDecTiger(&pdt);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"->>>      pdt.Print():       -");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  MultiAgentDecisionProcessDiscrete::Print((MultiAgentDecisionProcessDiscrete *)&pdt);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(&params);
  JESPExhaustivePlanner::JESPExhaustivePlanner
            (&JESPe,2,(DecPOMDPDiscreteInterface *)
                      (&pdt.super_DecPOMDPDiscrete + *(long *)(pdt._0_8_ + -0x50)),&params);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "->>> before SetHorizon()    JESPe.Print():       -");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  PlanningUnitMADPDiscrete::Print();
  PlanningUnitMADPDiscrete::SetHorizon((ulong)&JESPe);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"->>> after SetHorizon()    JESPe.Print():");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  PlanningUnitMADPDiscrete::Print();
  JESPExhaustivePlanner::~JESPExhaustivePlanner(&JESPe);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(&params);
  ProblemDecTiger::~ProblemDecTiger(&pdt);
  return;
}

Assistant:

void TestModelCreation(const ArgumentHandlers::Arguments& args)
{
    cout << "----------------------------------"<<endl;
    cout << "-       TestModelCreation()      -"<<endl;
    cout << "----------------------------------"<<endl;

    ProblemDecTiger pdt;
    cout << "----------------------------------"<<endl;
    cout << "->>>      pdt.Print():       -"<<endl;
    cout << "----------------------------------"<<endl;
    pdt.Print();
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeJointBeliefs(false);
    JESPExhaustivePlanner JESPe(2, &pdt, &params);
    cout << "----------------------------------"<<endl;
    cout << "->>> before SetHorizon()    JESPe.Print():       -"<<endl;
    cout << "----------------------------------"<<endl;
    JESPe.Print();     
//    JESPe.SetProblem(&pdt);
    JESPe.SetHorizon(2);
    cout << "----------------------------------"<<endl;
    cout << "->>> after SetHorizon()    JESPe.Print():"<<endl;
    cout << "----------------------------------"<<endl;
    JESPe.Print();
//Testing problems with the TransitonModelMapping
if(0){    
    cout << "creating some TransitionModelMapping..."<< endl; 
    TransitionModelMapping a(2,2);    
    a.Print();
}
if(0){//this is not leaking
    JointActionDiscrete* jai;
    ActionDiscrete* ai;
    cout << endl << "Joint action Memory leak test..." << endl; 
    for(int i=0; i < 10000; i++)
    {
    jai = new JointActionDiscrete();
    for(int j=0; j < 1000; j++)
    {
        ai = new ActionDiscrete(j);
        jai->AddIndividualAction(ai,j); 
         // DO delete ai: pointer to ai is stored (in _m_apVector), but
        // individual actions are not deleted when deleting joint action.
        // (multiple joint actions refer to the same indiv. action)
    }
    jai->Print();
    jai->DeleteIndividualActions();
    delete jai;
    }
    if(BEEP) cout <<"\nBeep!\a\n";
}
    //Mem. leak test - tests whether reinitialization of planning unit does not
    //leak
if(0){    
    int i=0;
    while(i < 100000)
    {
        JESPe.SetHorizon(10);
        i++;
    }
}    
    //Model (problem) creation mem. leak test
    //doesn't leak 2006-07-28
if(0){    
    int i=0;
    while(i < 100000) //comment out what you don't want to test.
    {
        delete ( new MultiAgentDecisionProcessDiscrete(2,2) );
//    delete ( new DecPOMDPDiscrete(2,2) );
//    delete ( new JESPExhaustivePlanner(3));
//    delete ( new ProblemDecTiger() );
        cout <<endl<< "-----------------starting new-----------------"<<endl;
    //    TestConstructActions* test_p_a =  new TestConstructActions();
        ProblemDecTiger* mt_problem_p = new ProblemDecTiger();
        JESPExhaustivePlanner* mt_jesp_p = new JESPExhaustivePlanner(3, 
            mt_problem_p);

        cout <<endl<< "-----------------ending new-----------------"<<endl;
        cout <<endl<< "-----------------starting delete-----------------"<<endl;
    //    delete test_p_a;        
        delete mt_jesp_p;
        delete mt_problem_p;
        cout <<endl<< "-----------------ending delete-----------------"<<endl;
        i++;
    }
}

#if 0
{ //bruteforce plan   h 3 
    BruteForceSearchPlanner bfs;
    bfs.Test();
    bfs.SetHorizon(3);
    cout << "#joint policies = "<<(int)bfs.GetNrJointPolicies()<<endl;
    bfs.Plan();
    double bfsVoptimal3 = bfs.GetExpectedReward();
    cout << endl<<">>> h=3 -> Optimal value = " << bfsVoptimal3 <<" <<<"<<endl;
}
#endif


}